

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O2

errc trial::protocol::bintoken::to_errc(value value)

{
  errc eVar1;
  
  eVar1 = no_error;
  if (value - error_unknown_token < 9) {
    eVar1 = *(errc *)(&DAT_00116e18 + (ulong)(value - error_unknown_token) * 4);
  }
  return eVar1;
}

Assistant:

inline enum errc to_errc(token::code::value value)
{
    switch (value)
    {
    case token::code::error_unknown_token:
        return unknown_token;

    case token::code::error_unexpected_token:
        return unexpected_token;

    case token::code::error_negative_length:
        return negative_length;

    case token::code::error_overflow:
        return overflow;

    case token::code::error_invalid_value:
        return invalid_value;

    case token::code::error_expected_end_record:
        return expected_end_record;

    case token::code::error_expected_end_array:
        return expected_end_array;

    case token::code::error_expected_end_assoc_array:
        return expected_end_assoc_array;

    default:
        return no_error;
    }
}